

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O3

pseudo_t add_binary_op(dmr_C *C,entrypoint *ep,symbol *ctype,int op,pseudo_t left,pseudo_t right)

{
  basic_block *pbVar1;
  symbol *ptr;
  pseudo_t ppVar2;
  undefined8 *puVar3;
  int iVar4;
  
  ptr = (symbol *)alloc_typed_instruction(C,op,ctype);
  ppVar2 = (pseudo_t)dmrC_allocator_allocate(&C->L->pseudo_allocator,0);
  ppVar2->type = PSEUDO_REG;
  iVar4 = C->L->nr + 1;
  C->L->nr = iVar4;
  ppVar2->nr = iVar4;
  (ppVar2->field_5).sym = ptr;
  ((anon_union_8_2_14638a90_for_instruction_5 *)&ptr->next_id)->target = ppVar2;
  ptr->replace = (symbol *)left;
  if (((left != (pseudo_t)0x0) && (left->type != PSEUDO_VOID)) && (left->type != PSEUDO_VAL)) {
    puVar3 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
    puVar3[1] = &ptr->replace;
    *puVar3 = ptr;
    ptrlist_add((ptr_list **)&left->users,puVar3,&C->ptrlist_allocator);
  }
  ptr->scope = (scope *)right;
  if (((right != (pseudo_t)0x0) && (right->type != PSEUDO_VOID)) && (right->type != PSEUDO_VAL)) {
    puVar3 = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
    puVar3[1] = &ptr->scope;
    *puVar3 = ptr;
    ptrlist_add((ptr_list **)&right->users,puVar3,&C->ptrlist_allocator);
  }
  pbVar1 = ep->active;
  if (pbVar1 != (basic_block *)0x0) {
    *(basic_block **)&(ptr->pos).field_0x4 = pbVar1;
    ptrlist_add((ptr_list **)&pbVar1->insns,ptr,&C->ptrlist_allocator);
  }
  return ppVar2;
}

Assistant:

static pseudo_t add_binary_op(struct dmr_C *C, struct entrypoint *ep, struct symbol *ctype, int op, pseudo_t left, pseudo_t right)
{
	struct instruction *insn = alloc_typed_instruction(C, op, ctype);
	pseudo_t target = dmrC_alloc_pseudo(C, insn);
	insn->target = target;
	dmrC_use_pseudo(C, insn, left, &insn->src1);
	dmrC_use_pseudo(C, insn, right, &insn->src2);
	add_one_insn(C, ep, insn);
	return target;
}